

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDependenceGraph.cpp
# Opt level: O2

void __thiscall
dg::LLVMDependenceGraph::handleInstruction
          (LLVMDependenceGraph *this,Value *val,LLVMNode *node,LLVMNode *prevNode)

{
  Value VVar1;
  LLVMPointerAnalysis *pLVar2;
  pointer ppFVar3;
  LLVMPointsToSetImpl *pLVar4;
  bool bVar5;
  char cVar6;
  LLVMNode *pLVar7;
  LLVMDependenceGraph *pLVar8;
  Use *pUVar9;
  long lVar10;
  Value *pVVar11;
  Function *pFVar12;
  Function *pFVar13;
  undefined8 uVar14;
  Function **function;
  pointer ppFVar15;
  StringRef RHS;
  StringRef RHS_00;
  undefined1 auVar16 [16];
  StringRef SVar17;
  StringRef RHS_01;
  StringRef RHS_02;
  LLVMNode *node_local;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> possibleFunctions;
  const_iterator __begin3;
  LLVMPointsToSetImpl *local_60;
  Function *local_58;
  Value *local_50;
  const_iterator __end3;
  StringRef local_40;
  
  VVar1 = val[0x10];
  node_local = node;
  if (val != (Value *)0x0 && VVar1 == (Value)0x53) {
    pVVar11 = (Value *)llvm::Value::stripPointerCasts();
    pFVar12 = (Function *)0x0;
    if (pVVar11[0x10] == (Value)0x0) {
      pFVar12 = (Function *)pVVar11;
    }
    if (pFVar12 == (Function *)0x0) {
      if ((*(char *)(*(long *)(val + -0x20) + 0x10) != '\x17') &&
         (pLVar2 = this->PTA, pLVar2 != (LLVMPointerAnalysis *)0x0)) {
        (**(code **)(*(long *)pLVar2 + 8))(&local_60,pLVar2,pVVar11);
        lVar10 = (**(code **)(*(long *)local_60 + 0x20))();
        if (lVar10 == 0) {
          llvmutils::printerr("Had no PTA node",pVVar11,true);
        }
        pLVar4 = local_60;
        local_58 = pFVar12;
        if (local_60 == (LLVMPointsToSetImpl *)0x0) {
          __begin3.impl = (LLVMPointsToSetImpl *)0x0;
        }
        else {
          cVar6 = (**(code **)(*(long *)local_60 + 0x38))(local_60);
          __begin3.impl = (LLVMPointsToSetImpl *)0x0;
          if (cVar6 == '\0') {
            __begin3.impl = pLVar4;
          }
        }
        __end3.impl = (LLVMPointsToSetImpl *)0x0;
        local_50 = val + 0x40;
        while( true ) {
          bVar5 = LLVMPointsToSet::const_iterator::operator!=(&__begin3,&__end3);
          if (!bVar5) break;
          pFVar12 = (Function *)(**(code **)(*(long *)__begin3.impl + 0x48))();
          if (pFVar12 != (Function *)0x0 && pFVar12[0x10] == (Function)0x0) {
            if ((*(Function **)(pFVar12 + 0x48) == pFVar12 + 0x48) ||
               (bVar5 = llvmutils::callIsCompatible(pFVar12,(CallInst *)val,LOOSE), !bVar5)) {
              if (this->threads == true) {
                SVar17 = (StringRef)llvm::Value::getName();
                RHS_01.Length = 0xe;
                RHS_01.Data = "pthread_create";
                bVar5 = llvm::operator==(SVar17,RHS_01);
                if (bVar5) {
                  getCalledFunctions(&possibleFunctions,
                                     *(Value **)
                                      (local_50 + -(ulong)(uint)(*(int *)(val + 0x14) << 5)),
                                     this->PTA);
                  ppFVar3 = possibleFunctions.
                            super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  for (ppFVar15 = possibleFunctions.
                                  super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start; pLVar7 = node_local,
                      ppFVar15 != ppFVar3; ppFVar15 = ppFVar15 + 1) {
                    pFVar12 = *ppFVar15;
                    if (*(Function **)(pFVar12 + 0x48) != pFVar12 + 0x48) {
                      pLVar8 = buildSubgraph(this,node_local,pFVar12,true);
                      Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::addSubgraph
                                (&pLVar7->
                                  super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>,
                                 pLVar8);
                    }
                  }
                  std::_Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                  ::~_Vector_base(&possibleFunctions.
                                   super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                                 );
                }
              }
            }
            else {
              pLVar8 = buildSubgraph(this,node_local,pFVar12,false);
              Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::addSubgraph
                        (&node_local->
                          super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>,pLVar8);
            }
          }
          LLVMPointsToSet::const_iterator::operator++(&__begin3);
        }
        pFVar12 = local_58;
        if (local_60 != (LLVMPointsToSetImpl *)0x0) {
          (**(code **)(*(long *)local_60 + 0x58))();
          pFVar12 = local_58;
        }
      }
    }
    else {
      if (this->gather_callsites != (char *)0x0) {
        possibleFunctions.
        super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>._M_impl.
        super__Vector_impl_data._0_16_ = llvm::Value::getName();
        llvm::StringRef::StringRef(&local_40,this->gather_callsites);
        bVar5 = llvm::StringRef::equals((StringRef *)&possibleFunctions,local_40);
        if (bVar5) {
          std::
          _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
          ::_M_insert_unique<dg::LLVMNode*const&>
                    ((_Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
                      *)this->gatheredCallsites,&node_local);
        }
      }
      if (*(Function **)(pFVar12 + 0x48) != pFVar12 + 0x48) {
        pLVar8 = buildSubgraph(this,node_local,pFVar12,false);
        Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::addSubgraph
                  (&node_local->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>,
                   pLVar8);
      }
    }
    pFVar13 = llvm::CallBase::getCalledFunction((CallBase *)val);
    if ((pFVar13 != (Function *)0x0) && (((byte)pFVar13[0x17] & 0x10) != 0)) {
      auVar16 = llvm::Value::getName();
      SVar17.Length = 6;
      SVar17.Data = "malloc";
      possibleFunctions.
      super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>._M_impl.
      super__Vector_impl_data._0_16_ = auVar16;
      bVar5 = llvm::StringRef::equals((StringRef *)&possibleFunctions,SVar17);
      if (!bVar5) {
        RHS.Length = 6;
        RHS.Data = "calloc";
        bVar5 = llvm::StringRef::equals((StringRef *)&possibleFunctions,RHS);
        if (!bVar5) {
          RHS_00.Length = 7;
          RHS_00.Data = "realloc";
          bVar5 = llvm::StringRef::equals((StringRef *)&possibleFunctions,RHS_00);
          if (!bVar5) goto LAB_0011e3e9;
        }
      }
      addFormalParameter(this,val);
    }
LAB_0011e3e9:
    if ((pFVar12 != (Function *)0x0) && (this->threads != false)) {
      SVar17 = (StringRef)llvm::Value::getName();
      RHS_02.Length = 0xe;
      RHS_02.Data = "pthread_create";
      bVar5 = llvm::operator==(SVar17,RHS_02);
      if (bVar5) {
        getCalledFunctions(&possibleFunctions,
                           *(Value **)(val + (0x40 - (ulong)(uint)(*(int *)(val + 0x14) << 5))),
                           this->PTA);
        ppFVar3 = possibleFunctions.
                  super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (ppFVar15 = possibleFunctions.
                        super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppFVar15 != ppFVar3;
            ppFVar15 = ppFVar15 + 1) {
          pLVar8 = buildSubgraph(this,node_local,*ppFVar15,true);
          Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::addSubgraph
                    (&node_local->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>,
                     pLVar8);
        }
        std::_Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::
        ~_Vector_base(&possibleFunctions.
                       super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                     );
      }
    }
    addCallNode(this,node_local);
    return;
  }
  if (VVar1 == (Value)0x22) {
    pLVar7 = getOrCreateNoReturn(this);
    Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::addControlDependence
              (&node->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>,pLVar7);
    if (prevNode == (LLVMNode *)0x0) {
      return;
    }
    Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::addControlDependence
              (&prevNode->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>,pLVar7);
    return;
  }
  if ((byte)VVar1 < 0x1b || val == (Value *)0x0) {
    return;
  }
  if (VVar1 != (Value)0x3d) {
    if (VVar1 == (Value)0x3c) {
      pUVar9 = llvm::User::getOperandList((User *)val);
      pVVar11 = (Value *)llvm::Value::stripInBoundsOffsets
                                   (*(undefined8 *)pUVar9,
                                    llvm::function_ref<void(llvm::Value_const*)>::
                                    callback_fn<llvm::Value::stripInBoundsOffsets(llvm::function_ref<void(llvm::Value_const*)>)::_default_arg_1_::_lambda(llvm::Value_const*)_1_>
                                    ,&possibleFunctions);
      if (pVVar11[0x10] == (Value)0x3) {
        addFormalGlobal(this,pVVar11);
      }
      pUVar9 = llvm::User::getOperandList((User *)val);
      uVar14 = *(undefined8 *)(pUVar9 + 0x20);
      goto LAB_0011e1ee;
    }
    if (VVar1 != (Value)0x3b) {
      return;
    }
  }
  pUVar9 = llvm::User::getOperandList((User *)val);
  uVar14 = *(undefined8 *)pUVar9;
LAB_0011e1ee:
  pVVar11 = (Value *)llvm::Value::stripInBoundsOffsets
                               (uVar14,llvm::function_ref<void(llvm::Value_const*)>::
                                       callback_fn<llvm::Value::stripInBoundsOffsets(llvm::function_ref<void(llvm::Value_const*)>)::_default_arg_1_::_lambda(llvm::Value_const*)_1_>
                                ,&possibleFunctions);
  if (pVVar11[0x10] == (Value)0x3) {
    addFormalGlobal(this,pVVar11);
  }
  return;
}

Assistant:

void LLVMDependenceGraph::handleInstruction(llvm::Value *val, LLVMNode *node,
                                            LLVMNode *prevNode) {
    using namespace llvm;

    if (CallInst *CInst = dyn_cast<CallInst>(val)) {
#if LLVM_VERSION_MAJOR >= 8
        Value *strippedValue = CInst->getCalledOperand()->stripPointerCasts();
#else
        Value *strippedValue = CInst->getCalledValue()->stripPointerCasts();
#endif
        Function *func = dyn_cast<Function>(strippedValue);
        // if func is nullptr, then this is indirect call
        // via function pointer. If we have the points-to information,
        // create the subgraph
        if (!func && !CInst->isInlineAsm() && PTA) {
            using namespace dg::pta;
            auto pts = PTA->getLLVMPointsTo(strippedValue);
            if (pts.empty()) {
                llvmutils::printerr("Had no PTA node", strippedValue);
            }
            for (const LLVMPointer &ptr : pts) {
                // vararg may introduce imprecision here, so we
                // must check that it is really pointer to a function
                Function *F = dyn_cast<Function>(ptr.value);
                if (!F)
                    continue;

                if (F->empty() || !llvmutils::callIsCompatible(F, CInst)) {
                    if (threads && F && F->getName() == "pthread_create") {
                        auto possibleFunctions = getCalledFunctions(
                                CInst->getArgOperand(2), PTA);
                        for (auto &function : possibleFunctions) {
                            if (!function->empty()) {
                                LLVMDependenceGraph *subg = buildSubgraph(
                                        node,
                                        const_cast<llvm::Function *>(function),
                                        true /*this is fork*/);
                                node->addSubgraph(subg);
                            }
                        }
                    } else {
                        // incompatible prototypes or the function
                        // is only declaration
                        continue;
                    }
                } else {
                    LLVMDependenceGraph *subg = buildSubgraph(node, F);
                    node->addSubgraph(subg);
                }
            }
        }

        if (func && gather_callsites &&
            func->getName().equals(gather_callsites)) {
            gatheredCallsites->insert(node);
        }

        if (is_func_defined(func)) {
            LLVMDependenceGraph *subg = buildSubgraph(node, func);
            node->addSubgraph(subg);
        }

        // if we allocate a memory in a function, we can pass
        // it to other functions, so it is like global.
        // We need it as parameter, so that if we define it,
        // we can add def-use edges from parent, through the parameter
        // to the definition
        if (isMemAllocationFunc(CInst->getCalledFunction()))
            addFormalParameter(val);

        if (threads && func && func->getName() == "pthread_create") {
            auto possibleFunctions =
                    getCalledFunctions(CInst->getArgOperand(2), PTA);
            for (auto &function : possibleFunctions) {
                auto *subg = buildSubgraph(
                        node, const_cast<llvm::Function *>(function),
                        true /*this is fork*/);
                node->addSubgraph(subg);
            }
        }

        // no matter what is the function, this is a CallInst,
        // so create call-graph
        addCallNode(node);
    } else if (isa<UnreachableInst>(val)) {
        auto *noret = getOrCreateNoReturn();
        node->addControlDependence(noret);
        // unreachable is being inserted because of the previous instr
        // aborts the program. This means that whether it is executed
        // depends on the previous instr
        if (prevNode)
            prevNode->addControlDependence(noret);
    } else if (Instruction *Inst = dyn_cast<Instruction>(val)) {
        if (isa<LoadInst>(val) || isa<GetElementPtrInst>(val)) {
            Value *op = Inst->getOperand(0)->stripInBoundsOffsets();
            if (isa<GlobalVariable>(op))
                addFormalGlobal(op);
        } else if (isa<StoreInst>(val)) {
            Value *op = Inst->getOperand(0)->stripInBoundsOffsets();
            if (isa<GlobalVariable>(op))
                addFormalGlobal(op);

            op = Inst->getOperand(1)->stripInBoundsOffsets();
            if (isa<GlobalVariable>(op))
                addFormalGlobal(op);
        }
    }
}